

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O1

void __thiscall Scs::Server::DisconnectClient(Server *this,ClientID clientId)

{
  int iVar1;
  iterator __begin1;
  _List_node_base *p_Var2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_connectionListMutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  p_Var2 = (this->m_connectionList).
           super__List_base<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var2 == (_List_node_base *)&this->m_connectionList) {
LAB_00162eea:
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_connectionListMutex);
      return;
    }
    if (*(int *)&p_Var2[1]._M_next[2]._M_next == clientId) {
      *(undefined1 *)((long)(p_Var2[1]._M_next + 2) + 4) = 0;
      goto LAB_00162eea;
    }
    p_Var2 = p_Var2->_M_next;
  } while( true );
}

Assistant:

void Server::DisconnectClient(ClientID clientId)
{
	std::lock_guard<std::mutex> lock(m_connectionListMutex);
	if (m_connectionList.empty())
		return;
	for (auto & connection : m_connectionList)
	{
		if (connection->clientID == clientId)
		{
			connection->connected = false;
			return;
		}
	}
}